

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::f_ftilda(Forth *this)

{
  ForthStack<double> *this_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint x;
  double dVar5;
  double dVar6;
  double dVar7;
  ulong uVar8;
  int iVar9;
  
  requireDStackAvailable(this,3,"F~");
  requireFStackDepth(this,3,"F~");
  this_00 = &this->fStack;
  dVar5 = ForthStack<double>::getTop(this_00,0);
  ForthStack<double>::pop(this_00);
  dVar6 = ForthStack<double>::getTop(this_00,0);
  ForthStack<double>::pop(this_00);
  dVar7 = ForthStack<double>::getTop(this_00,0);
  ForthStack<double>::pop(this_00);
  x = this->False;
  if (dVar5 <= 0.0) {
    if (((dVar5 != 0.0) || (NAN(dVar5))) || (dVar7 != dVar6)) goto LAB_00118402;
  }
  else if (dVar5 <= ABS(dVar6 - dVar7)) goto LAB_00118402;
  x = this->True;
LAB_00118402:
  if (dVar5 < 0.0) {
    uVar3 = (uint)(dVar7 - dVar6);
    uVar1 = -uVar3;
    if (0 < (int)uVar3) {
      uVar1 = uVar3;
    }
    iVar4 = (int)dVar5;
    iVar2 = -iVar4;
    if (0 < iVar4) {
      iVar2 = iVar4;
    }
    iVar4 = (int)dVar7 >> 0x1f;
    iVar9 = (int)dVar6 >> 0x1f;
    uVar8 = CONCAT44((int)dVar6,(int)dVar7) ^ CONCAT44(iVar9,iVar4);
    if (uVar1 < (uint)((((int)(uVar8 >> 0x20) - iVar9) + ((int)uVar8 - iVar4)) * iVar2)) {
      x = this->True;
    }
  }
  ForthStack<unsigned_int>::push(&this->dStack,x);
  return;
}

Assistant:

void f_ftilda(){
			REQUIRE_DSTACK_AVAILABLE(3, "F~");
			REQUIRE_FSTACK_DEPTH(3, "F~");
			auto r3 = fStack.getTop(0); fStack.pop();
			auto r2 = fStack.getTop(0); fStack.pop();
			auto r1 = fStack.getTop(0); fStack.pop();
			Cell ret = False;
			if (r3 > 0.0){
				if (fabs(r2 - r1) < r3) ret = True;
			}
			else if ((r3 == 0.0) || (r3 == -0.0)){
				if (memcmp(&r1, &r2,sizeof(r1))==0) 
					ret = True;
			} if (r3 < 0.0){
				if (abs(r1 - r2) < (abs(r3)*(abs(r1) + abs(r2)))) ret = True;
			}
			dStack.push(ret);
		}